

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O1

int av1_pack_bitstream(AV1_COMP *cpi,uint8_t *dst,size_t dst_size,size_t *size,int *largest_tile_id)

{
  uint8_t *dst_00;
  FRAME_TYPE FVar1;
  _Bool _Var2;
  int iVar3;
  int iVar4;
  uint uVar5;
  aom_metadata_array_t *paVar6;
  aom_metadata_t *paVar7;
  TileDataEnc *pTVar8;
  size_t __n;
  undefined6 uVar9;
  uint32_t uVar10;
  byte bVar11;
  uint32_t uVar12;
  int iVar13;
  aom_metadata_insert_flags_t aVar14;
  int iVar15;
  uint uVar16;
  uint num_workers;
  uchar *mem;
  size_t sVar17;
  size_t sVar18;
  int iVar19;
  uint uVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  size_t *psVar24;
  AV1_PRIMARY *pAVar25;
  ulong uVar26;
  uint uVar27;
  int iVar28;
  uint64_t value;
  AV1_PRIMARY *pAVar29;
  byte *pbVar30;
  AV1_COMP *pAVar31;
  ulong uVar32;
  int row;
  size_t move_size;
  byte *pbVar33;
  long lVar34;
  bool bVar35;
  bool bVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  uint32_t total_size;
  undefined8 uStack_101a0;
  ThreadData_conflict *pTStack_10198;
  byte *pbStack_10190;
  byte *pbStack_10188;
  long lStack_10180;
  AV1_COMP *pAStack_10178;
  int col;
  uint uStack_10164;
  uint32_t obu_header_size;
  uint max_tile_size;
  byte *pbStack_10158;
  MACROBLOCKD *pMStack_10150;
  AV1_PRIMARY *pAStack_10148;
  byte *pbStack_10140;
  byte *pbStack_10138;
  AV1_COMMON *pAStack_10130;
  aom_write_bit_buffer aStack_10128;
  int *piStack_10118;
  ulong uStack_10110;
  ulong uStack_10108;
  ThreadData_conflict *pTStack_10100;
  byte *pbStack_100f8;
  ulong uStack_100f0;
  void *pvStack_100e8;
  uint32_t uStack_100dc;
  CommonTileParams *pCStack_100d8;
  TileInfo tile_info;
  FrameHeaderInfo fh_info;
  int iStack_10098;
  int unused;
  int tile_size_bytes_1;
  int tile_size_bytes;
  uint uStack_1006c;
  byte bStack_10040;
  size_t coded_obu_size;
  uint8_t *puStack_10030;
  uint uStack_10028;
  undefined4 uStack_10024;
  uint32_t *puStack_10020;
  byte *pbStack_10018;
  byte *pbStack_10010;
  uint8_t local_10000;
  undefined8 local_fffc;
  int local_fff0;
  int local_ffec;
  uint local_ffe8;
  int local_ffe4;
  
  pAVar29 = cpi->ppi;
  fh_info.frame_header = (uint8_t *)0x0;
  fh_info.obu_header_byte_offset = 0;
  fh_info.total_length = 0;
  if (((cpi->common).delta_q_info.delta_q_present_flag != 0) && (cpi->deltaq_used == 0)) {
    (cpi->common).delta_q_info.delta_q_present_flag = 0;
  }
  iVar13 = (cpi->common).temporal_layer_id;
  iVar19 = (cpi->common).spatial_layer_id;
  cpi->frame_header_count = 0;
  pAStack_10178 = cpi;
  pbStack_10158 = dst;
  piStack_10118 = largest_tile_id;
  lStack_10180._0_4_ = iVar19;
  if (((cpi->common).current_frame.frame_type & 0xfd) != 0) goto LAB_00192588;
  if (dst_size < 2) {
    return 1;
  }
  uStack_101a0 = CONCAT44(uStack_101a0._4_4_,iVar13);
  *dst = '\n';
  dst_00 = dst + 1;
  uVar12 = av1_write_sequence_header_obu((cpi->common).seq_params,dst_00,dst_size);
  uVar23 = (ulong)uVar12;
  sVar17 = aom_uleb_size_in_bytes(uVar23);
  if ((dst_size < uVar23) || (dst_size - uVar23 < sVar17 + 1 || dst_size == uVar23)) {
    sVar17 = 0;
  }
  else {
    memmove(pbStack_10158 + sVar17 + 1,dst_00,uVar23);
  }
  if (sVar17 == 0) {
LAB_0019256b:
    bVar36 = false;
    dst = pbStack_10158;
    iVar13 = (uint)uStack_101a0;
  }
  else {
    coded_obu_size = 0;
    iVar13 = aom_uleb_encode(uVar23,sVar17,dst_00,&coded_obu_size);
    bVar36 = false;
    if (iVar13 != 0) goto LAB_0019256b;
    dst = pbStack_10158;
    iVar13 = (uint)uStack_101a0;
    if (coded_obu_size == sVar17) {
      dst_size = dst_size - (uVar23 + sVar17 + 1);
      bVar36 = true;
      dst = pbStack_10158 + uVar23 + sVar17 + 1;
    }
  }
  if (!bVar36) {
    return 1;
  }
LAB_00192588:
  uVar27 = iVar13 << 5;
  lStack_10180._0_4_ = (uint)lStack_10180 << 3;
  pAStack_10130 = &pAStack_10178->common;
  pAVar31 = pAStack_10178;
  if ((pAStack_10178->common).show_frame != 0) {
    pAStack_10148 = pAVar29;
    pbStack_10138 = (byte *)dst_size;
    if (((pAStack_10178->source == (YV12_BUFFER_CONFIG *)0x0) ||
        (paVar6 = pAStack_10178->source->metadata, paVar6 == (aom_metadata_array_t *)0x0)) ||
       (paVar6->sz == 0)) {
      pTStack_10198 = (ThreadData_conflict *)0x0;
    }
    else {
      uVar23 = 0;
      pTStack_10198 = (ThreadData_conflict *)0x0;
      uStack_101a0 = CONCAT44(uStack_101a0._4_4_,uVar27);
      pbVar30 = dst;
      pbStack_10190 = (byte *)dst_size;
      pbStack_10140 = dst;
      do {
        paVar7 = paVar6->metadata_array[uVar23];
        if ((paVar7 != (aom_metadata_t *)0x0) && (paVar7->payload != (uint8_t *)0x0)) {
          aVar14 = paVar7->insert_flag & 0xf;
          FVar1 = (pAStack_10130->current_frame).frame_type;
          if (((FVar1 == '\0') && (aVar14 == AOM_MIF_KEY_FRAME)) ||
             (aVar14 == AOM_MIF_ANY_FRAME || aVar14 == AOM_MIF_NON_KEY_FRAME && FVar1 != '\0')) {
            if (pbStack_10190 < (byte *)0x2) {
              aom_internal_error((pAVar31->common).error,AOM_CODEC_ERROR,
                                 "av1_write_metadata_array: output buffer full");
            }
            bVar11 = (byte)((paVar7->insert_flag & AOM_MIF_NON_KEY_FRAME_LAYER_SPECIFIC) >> 4) &
                     ((pAVar31->common).seq_params)->has_nonzero_operating_point_idc;
            *pbVar30 = bVar11 * '\x04' | 0x2a;
            uVar26 = 1;
            if (bVar11 == 1) {
              pbVar30[1] = 0;
              uVar26 = 2;
            }
            _col = pbVar30 + uVar26;
            uVar32 = (long)pbStack_10190 - uVar26;
            coded_obu_size = 0;
            pbStack_10188 = pbVar30;
            iVar13 = aom_uleb_encode((ulong)paVar7->type,uVar32,_col,&coded_obu_size);
            if ((iVar13 == 0) && (paVar7->sz + coded_obu_size + 1 <= uVar32)) {
              pbVar30 = _col + coded_obu_size;
              lVar21 = coded_obu_size + 1;
              memcpy(pbVar30,paVar7->payload,paVar7->sz);
              pbVar30[paVar7->sz] = 0x80;
              pbVar30 = (byte *)(lVar21 + paVar7->sz);
            }
            else {
              pbVar30 = (byte *)0x0;
            }
            if (pbVar30 == (byte *)0x0) {
              aom_internal_error((pAStack_10178->common).error,AOM_CODEC_ERROR,
                                 "av1_write_metadata_array: output buffer full");
            }
            sVar17 = aom_uleb_size_in_bytes((uint64_t)pbVar30);
            if ((pbStack_10190 < pbVar30) || ((ulong)((long)pbStack_10190 - (long)pbVar30) < uVar26)
               ) {
              sVar18 = 0;
            }
            else {
              sVar18 = 0;
              if (sVar17 + uVar26 <= (ulong)((long)pbStack_10190 - (long)pbVar30)) {
                memmove(pbStack_10188 + sVar17 + uVar26,_col,(size_t)pbVar30);
                sVar18 = sVar17;
              }
            }
            if (sVar18 == 0) {
              aom_internal_error((pAStack_10178->common).error,AOM_CODEC_ERROR,
                                 "av1_write_metadata_array: output buffer full");
            }
            coded_obu_size = 0;
            iVar13 = aom_uleb_encode((uint64_t)pbVar30,sVar18,_col,&coded_obu_size);
            pAVar31 = pAStack_10178;
            if ((iVar13 == 0) && (coded_obu_size == sVar18)) {
              pbVar30 = pbVar30 + sVar18 + uVar26;
              pbStack_10190 = pbStack_10190 + -(long)pbVar30;
              pTStack_10198 = (ThreadData_conflict *)(pbVar30 + (long)&pTStack_10198->mb);
              dst = pbStack_10140;
              pbVar30 = pbStack_10188 + (long)pbVar30;
              uVar27 = (uint)uStack_101a0;
            }
            else {
              aom_internal_error((pAStack_10178->common).error,AOM_CODEC_ERROR,
                                 "av1_write_metadata_array: output buffer full");
              dst = pbStack_10140;
              pbVar30 = pbStack_10188;
              uVar27 = (uint)uStack_101a0;
            }
          }
        }
        uVar23 = uVar23 + 1;
      } while (uVar23 < paVar6->sz);
    }
    dst = dst + (long)pTStack_10198;
    dst_size = (size_t)(pbStack_10138 + -(long)pTStack_10198);
    pAVar29 = pAStack_10148;
  }
  lStack_10180._0_4_ = (uint)lStack_10180 | uVar27;
  if ((pAVar31->num_tg < 2) &&
     (((pAVar31->common).show_existing_frame == 0 ||
      (((pAVar31->common).features.error_resilient_mode == true &&
       ((pAStack_10130->current_frame).frame_type != '\0')))))) {
    aStack_10128.bit_offset = 0;
    aStack_10128._12_4_ = 0;
    aStack_10128.bit_buffer = (uint8_t *)0x0;
    sVar17 = 0;
  }
  else {
    aStack_10128.bit_offset = 0;
    aStack_10128._12_4_ = 0;
    aStack_10128.bit_buffer = (uint8_t *)0x0;
    if (dst_size < (byte *)0x2) {
      return 1;
    }
    _Var2 = ((pAVar31->common).seq_params)->has_nonzero_operating_point_idc;
    if ((pAVar29->level_params).keep_level_stats != 0) {
      pAVar31->frame_header_count = pAVar31->frame_header_count + 1;
    }
    *dst = _Var2 * '\x04' | 0x1a;
    uVar23 = 1;
    if (_Var2 != false) {
      dst[1] = (byte)(uint)lStack_10180;
      uVar23 = 2;
    }
    pbVar30 = dst + uVar23;
    fh_info.frame_header = dst;
    uVar12 = write_frame_header_obu(pAVar31,&(pAVar31->td).mb.e_mbd,&aStack_10128,pbVar30,1);
    pbVar33 = (byte *)(ulong)uVar12;
    sVar18 = aom_uleb_size_in_bytes((uint64_t)pbVar33);
    sVar17 = 0;
    if (((pbVar33 <= dst_size) && (uVar23 <= dst_size - (long)pbVar33)) &&
       (sVar18 + uVar23 <= dst_size - (long)pbVar33)) {
      memmove(dst + sVar18 + uVar23,pbVar30,(size_t)pbVar33);
      sVar17 = sVar18;
    }
    if (sVar17 == 0) {
      return 1;
    }
    coded_obu_size = 0;
    iVar13 = aom_uleb_encode((uint64_t)pbVar33,sVar17,pbVar30,&coded_obu_size);
    if (iVar13 != 0) {
      return 1;
    }
    if (coded_obu_size != sVar17) {
      return 1;
    }
    fh_info.obu_header_byte_offset = 0;
    fh_info.total_length = (size_t)(pbVar33 + sVar17 + uVar23);
    if (fh_info.total_length >> 0x20 != 0) {
      return 1;
    }
    dst = dst + fh_info.total_length;
    pAVar31 = pAStack_10178;
  }
  if (((pAVar31->common).show_existing_frame == 0) ||
     (((pAVar31->common).features.error_resilient_mode == true &&
      ((pAStack_10130->current_frame).frame_type != '\0')))) {
    if (aStack_10128.bit_buffer != (uint8_t *)0x0) {
      aStack_10128.bit_buffer = aStack_10128.bit_buffer + sVar17;
    }
    *piStack_10118 = 0;
    if (((pAVar31->common).seg.enabled != '\0') && ((pAVar31->common).seg.update_map != '\0')) {
      if ((pAVar31->common).features.primary_ref_frame == 7) {
        bVar36 = false;
      }
      else {
        (pAVar31->common).seg.temporal_update = '\x01';
        bVar36 = (pAVar31->td).rd_counts.seg_tmp_pred_cost[1] <=
                 (pAVar31->td).rd_counts.seg_tmp_pred_cost[0];
      }
      (pAVar31->common).seg.temporal_update = bVar36;
    }
    pCStack_100d8 = &(pAVar31->common).tiles;
    pbStack_10140 = dst;
    if ((pAVar31->common).tiles.large_scale == 0) {
      total_size = 0;
      max_tile_size = 0;
      obu_header_size = 0;
      uVar27 = (pAVar31->common).tiles.cols;
      pAVar29 = (AV1_PRIMARY *)(ulong)uVar27;
      uVar5 = (pAVar31->common).tiles.rows;
      uStack_10110 = (ulong)uVar5;
      uVar27 = uVar5 * uVar27;
      num_workers = 1;
      if ((pAVar31->mt_info).pack_bs_mt_enabled == true) {
        uVar20 = (pAVar31->mt_info).num_mod_workers[9];
        if ((int)uVar27 < 1) {
          fVar37 = 0.0;
        }
        else {
          lVar21 = 0;
          uVar23 = 0;
          do {
            uVar23 = uVar23 + *(long *)((long)pAVar31->tile_data->inter_mode_rd_models +
                                       lVar21 + -0x10);
            lVar21 = lVar21 + 0x5d10;
          } while ((ulong)uVar27 * 0x5d10 - lVar21 != 0);
          if ((long)uVar23 < 0) {
            fVar37 = (float)uVar23;
          }
          else {
            fVar37 = (float)(long)uVar23;
          }
        }
        if (1 < (int)uVar20) {
          fVar38 = 0.0;
          uVar16 = 1;
          do {
            fVar39 = (float)(int)uVar20;
            fVar39 = (fVar39 * -5.0 + ((float)(int)(uVar20 - 1) / fVar39) * fVar37) -
                     (float)(int)uVar27 / fVar39;
            num_workers = uVar20;
            if (fVar39 <= fVar38) {
              fVar39 = fVar38;
              num_workers = uVar16;
            }
            fVar38 = fVar39;
            bVar36 = 2 < (int)uVar20;
            uVar20 = uVar20 - 1;
            uVar16 = num_workers;
          } while (bVar36);
        }
      }
      pbStack_100f8 = dst;
      if (num_workers < 2) {
        pTStack_10198 = &pAVar31->td;
        pbStack_10138 =
             (byte *)CONCAT44(pbStack_10138._4_4_,
                              (int)(pAVar31->num_tg + uVar27 + -1) / pAVar31->num_tg);
        _tile_size_bytes = 0;
        tile_info.mi_row_start = 1;
        pbStack_10188 = (byte *)0x0;
        (pAVar31->td).interp_filter_selected[2] = 0;
        (pAVar31->td).interp_filter_selected[3] = 0;
        (pAVar31->td).coefficient_size = 0;
        (pAVar31->td).max_mv_magnitude = 0;
        (pAVar31->td).interp_filter_selected[0] = 0;
        (pAVar31->td).interp_filter_selected[1] = 0;
        uStack_10108 = (ulong)uVar27;
        if (0 < (int)uVar5) {
          pMStack_10150 = &(pAVar31->td).mb.e_mbd;
          pvStack_100e8 = (void *)((long)pAVar29 * 0x5d10);
          uStack_100f0 = -(ulong)(uVar27 - 1);
          iVar13 = 1;
          lVar21 = 0x20;
          lVar34 = 0;
          uStack_101a0 = 0;
          pbVar30 = dst;
          pAStack_10148 = pAVar29;
          do {
            pTStack_10100 = (ThreadData_conflict *)lVar21;
            if (0 < (int)pAVar29) {
              pAStack_10130 = (AV1_COMMON *)(uStack_100f0 + lVar34);
              pAVar25 = (AV1_PRIMARY *)0x0;
              do {
                pAVar31 = pAStack_10178;
                if (iVar13 == 0) {
                  pbStack_10188 = (byte *)(ulong)((int)pbStack_10188 + 1);
                }
                else {
                  pbStack_10188 = (byte *)0x1;
                }
                bVar36 = (int)pbStack_10188 == (int)pbStack_10138;
                bVar35 = (long)pAStack_10130->buffer_removal_times +
                         (long)(pAVar25[-1].rtc_ref.buffer_time_index + 3) == 0;
                _col = pbVar30;
                if (iVar13 != 0) {
                  _col = dst + total_size;
                }
                (pAStack_10178->td).mb.e_mbd.tile_ctx =
                     (FRAME_CONTEXT *)
                     ((long)((pAStack_10178->tile_data->tctx).txb_skip_cdf + -1) + 0x2e + lVar21);
                local_ffe8 = (uint)(bVar35 || bVar36);
                pbStack_10190 = (byte *)CONCAT44(pbStack_10190._4_4_,local_ffe8);
                local_10000 = (uint8_t)lStack_10180;
                local_fffc._0_4_ = 0;
                local_fffc._4_4_ = 0;
                coded_obu_size = (size_t)&aStack_10128;
                iVar19 = (int)pAVar25;
                local_fff0 = (int)uStack_101a0;
                puStack_10020 = &total_size;
                pbStack_10018 = dst;
                pbStack_10010 = _col;
                local_ffec = iVar19;
                local_ffe4 = iVar13;
                if (iVar13 == 0) {
                  av1_pack_tile_info(pAStack_10178,pTStack_10198,(PackBSParams *)&coded_obu_size);
                }
                else {
                  av1_write_obu_tg_tile_headers
                            (pAStack_10178,pMStack_10150,(PackBSParams *)&coded_obu_size,
                             (int)lVar34 + iVar19);
                  av1_pack_tile_info(pAVar31,pTStack_10198,(PackBSParams *)&coded_obu_size);
                  _tile_size_bytes = (ulong)local_fffc._4_4_;
                  pbStack_100f8 = pbStack_100f8 + _tile_size_bytes;
                  obu_header_size = (uint32_t)local_fffc;
                }
                pAVar29 = pAStack_10148;
                pbVar30 = _col;
                pAVar31 = pAStack_10178;
                _tile_size_bytes =
                     _tile_size_bytes +
                     CONCAT44(uStack_10024,uStack_10028) + (ulong)(!bVar35 && !bVar36) * 4;
                if ((ulong)max_tile_size < CONCAT44(uStack_10024,uStack_10028)) {
                  *piStack_10118 = (int)lVar34 + iVar19;
                  max_tile_size = uStack_10028;
                }
                iVar13 = (int)pbStack_10190;
                if ((int)pbStack_10190 != 0) {
                  av1_write_last_tile_info
                            (pAStack_10178,&fh_info,&aStack_10128,(size_t *)&tile_size_bytes,_col,
                             &total_size,&pbStack_100f8,piStack_10118,&tile_info.mi_row_start,
                             obu_header_size,(uint8_t)lStack_10180);
                  iVar13 = (int)pbStack_10190;
                }
                total_size = total_size + uStack_10028;
                pAVar25 = (AV1_PRIMARY *)((long)pAVar25->parallel_cpi + 1);
                lVar21 = lVar21 + 0x5d10;
                dst = pbStack_10140;
              } while (pAVar29 != pAVar25);
            }
            uStack_101a0 = uStack_101a0 + 1;
            lVar34 = (long)pAVar29->parallel_cpi + lVar34;
            lVar21 = (long)pTStack_10100 + (long)pvStack_100e8;
          } while (uStack_101a0 != uStack_10110);
        }
        av1_accumulate_pack_bs_thread_data(pAVar31,pTStack_10198);
        uVar27 = (uint)uStack_10108;
      }
      else {
        av1_write_tile_obu_mt
                  (pAVar31,dst,&total_size,&aStack_10128,(byte)lStack_10180,&fh_info,piStack_10118,
                   &max_tile_size,&obu_header_size,&pbStack_100f8,num_workers);
      }
      pbVar30 = pbStack_100f8;
      uVar5 = max_tile_size;
      uVar12 = obu_header_size;
      if (1 < (int)uVar27) {
        uVar23 = (ulong)obu_header_size;
        aom_wb_overwrite_literal
                  (&aStack_10128,*piStack_10118,
                   (pAVar31->common).tiles.log2_rows + (pAVar31->common).tiles.log2_cols);
        pbVar33 = pbStack_10140;
        if (pAVar31->num_tg == 1) {
          tile_size_bytes_1 = 4;
          iVar19 = (int)pbVar30 - (int)pbStack_10140;
          iVar13 = remux_tiles(pCStack_100d8,pbVar30,total_size - iVar19,uVar5,0,&tile_size_bytes_1,
                               &unused);
          total_size = iVar13 + iVar19;
          aom_wb_overwrite_literal(&aStack_10128,tile_size_bytes_1 + -1,2);
          aom_uleb_decode(pbVar33 + uVar23,(ulong)(total_size - uVar12),&coded_obu_size,
                          (size_t *)&tile_size_bytes);
          value = (total_size - uVar12) - _tile_size_bytes;
          if (value != coded_obu_size) {
            aom_uleb_encode(value,_tile_size_bytes,pbVar33 + uVar23,(size_t *)&tile_info);
            uVar26 = _tile_size_bytes;
            iVar13 = tile_info.mi_row_start;
            if (CONCAT44(tile_info.mi_row_end,tile_info.mi_row_start) < _tile_size_bytes) {
              memmove(pbStack_10140 + uVar23 + CONCAT44(tile_info.mi_row_end,tile_info.mi_row_start)
                      ,pbStack_10140 + uVar23 + _tile_size_bytes,coded_obu_size);
              total_size = total_size + (iVar13 - (int)uVar26);
            }
          }
        }
      }
    }
    else {
      iVar13 = (pAVar31->common).tiles.rows;
      _Var2 = ((pAVar31->common).seq_params)->has_nonzero_operating_point_idc;
      if ((pAVar31->ppi->level_params).keep_level_stats != 0) {
        pAVar31->frame_header_count = pAVar31->frame_header_count + 1;
      }
      pMStack_10150 =
           (MACROBLOCKD *)CONCAT44(pMStack_10150._4_4_,iVar13 * (pAVar31->common).tiles.cols);
      *dst = _Var2 * '\x04' | 0x32;
      lVar21 = 1;
      if (_Var2 != false) {
        dst[1] = (byte)lStack_10180;
        lVar21 = 2;
      }
      pbVar30 = dst + lVar21;
      uVar12 = write_frame_header_obu(pAVar31,&(pAVar31->td).mb.e_mbd,&aStack_10128,pbVar30,0);
      if ((pAVar31->oxcf).tile_cfg.enable_ext_tile_debug == true) {
        puStack_10030 = (uint8_t *)0x0;
        uStack_10028 = 0;
        uVar27 = (pAVar31->common).current_frame.frame_number;
        coded_obu_size._0_5_ = CONCAT14((char)(uVar27 / 100) + '0',0x68662f2e);
        uVar9 = CONCAT15((char)((ulong)(uVar27 % 100) * 0x1999999a >> 0x20),
                         (undefined5)coded_obu_size);
        coded_obu_size =
             (size_t)(CONCAT16((char)uVar27 + (char)(uVar27 / 10) * -10,uVar9) | 0x30300000000000);
        av1_print_uncompressed_frame_header(pbVar30,uVar12,(char *)&coded_obu_size);
      }
      iVar13 = (pAVar31->common).tiles.cols;
      pTStack_10100 = &pAVar31->td;
      pTStack_10198 = (ThreadData_conflict *)(ulong)(uint)(pAVar31->common).tiles.rows;
      (pAVar31->td).coefficient_size = 0;
      (pAVar31->td).max_mv_magnitude = 0;
      (pAVar31->td).interp_filter_selected[0] = 0;
      (pAVar31->td).interp_filter_selected[1] = 0;
      (pAVar31->td).interp_filter_selected[2] = 0;
      (pAVar31->td).interp_filter_selected[3] = 0;
      pAStack_10148 = (AV1_PRIMARY *)pbVar30;
      uStack_100dc = uVar12;
      if ((long)iVar13 < 1) {
        uStack_10164 = 0;
        uStack_101a0 = (ulong)uStack_101a0._4_4_ << 0x20;
      }
      else {
        lStack_10180 = (ulong)(1 < (int)pMStack_10150) << 2;
        uStack_10164 = 0;
        uStack_101a0 = (ulong)uStack_101a0._4_4_ << 0x20;
        pbVar30 = (byte *)0x0;
        uVar23 = (ulong)uVar12;
        pbStack_10138 = (byte *)(long)iVar13;
        do {
          av1_tile_set_col(&tile_info,pAStack_10130,(int)pbVar30);
          uVar26 = (ulong)((int)uVar23 + 4);
          if (pbVar30 == (byte *)(ulong)(iVar13 - 1)) {
            uVar26 = uVar23;
          }
          _col = pbVar30;
          if (0 < (int)pTStack_10198) {
            pbStack_10190 = (byte *)((long)pbVar30 << 4);
            uVar32 = 0;
            do {
              psVar24 = &coded_obu_size + uVar32 * 0x80;
              pbVar30 = _col + uVar32 * (long)pbStack_10138;
              pTVar8 = pAVar31->tile_data;
              row = (int)uVar32;
              av1_tile_set_row(&tile_info,pAStack_10130,row);
              iVar19 = (int)uVar26;
              pbStack_10188 = (byte *)((long)pAStack_10148 + uVar26);
              *(byte **)(pbStack_10190 + (long)psVar24) = pbStack_10188;
              (pAVar31->td).mb.e_mbd.tile_ctx = &pTVar8[(long)pbVar30].tctx;
              if ((pAVar31->common).tiles.large_scale == 0) {
                bStack_10040 = (pAVar31->common).features.disable_cdf_update ^ 1;
              }
              else {
                bStack_10040 = 0;
              }
              aom_start_encode((aom_writer *)&tile_size_bytes,pbStack_10188 + lStack_10180);
              write_modes(pAVar31,pTStack_10100,&tile_info,(aom_writer *)&tile_size_bytes,row,
                          (int)_col);
              iVar15 = aom_stop_encode((aom_writer *)&tile_size_bytes);
              if (iVar15 < 0) {
                aom_internal_error((pAVar31->common).error,AOM_CODEC_ERROR,"Error writing modes");
              }
              uVar22 = _tile_size_bytes & 0xffffffff;
              *(ulong *)(pbStack_10190 + (long)psVar24 + 8) = uVar22;
              if ((uint)uStack_101a0 < (uint)tile_size_bytes) {
                *piStack_10118 = (int)pbVar30;
                uStack_101a0 = CONCAT44(uStack_101a0._4_4_,tile_size_bytes);
              }
              iVar15 = tile_size_bytes;
              if (1 < (int)pMStack_10150) {
                iVar28 = tile_size_bytes + -1;
                iVar3 = (pAStack_10178->common).tiles.width;
                iVar4 = (pAStack_10178->common).tiles.height;
                if (iVar4 < iVar3) {
                  iVar4 = iVar3;
                }
                uStack_10110 = uVar22;
                if (((pAStack_10178->common).current_frame.frame_type != '\0') &&
                   (iVar4 * 4 < 0x101)) {
                  uStack_10108 = CONCAT44(uStack_10108._4_4_,iVar28);
                  if (uVar32 == 0) {
LAB_00192ea4:
                    uVar27 = 0;
                  }
                  else {
                    __n = *(size_t *)(pbStack_10190 + 8 + (long)psVar24);
                    pvStack_100e8 = (void *)(*(long *)(pbStack_10190 + (long)psVar24) + 4);
                    pbVar30 = pbStack_10190 + (long)(&coded_obu_size + (uVar32 - 1) * 0x80);
                    bVar36 = true;
                    uStack_100f0 = CONCAT44(uStack_100f0._4_4_,iVar19);
                    do {
                      iVar19 = (int)uVar26;
                      if (!bVar36) goto LAB_00192ea4;
                      bVar11 = *(byte *)(*(long *)pbVar30 + 3);
                      uVar27 = (bVar11 & 0x7f) + 1;
                      iVar19 = row - uVar27;
                      if (-1 < (char)bVar11) {
                        iVar19 = (int)(uVar32 - 1);
                      }
                      if (-1 < (char)bVar11) {
                        uVar27 = 1;
                      }
                      bVar35 = true;
                      if ((uVar27 < 0x80) &&
                         (*(size_t *)
                           (pbStack_10190 + (long)(&coded_obu_size + (long)iVar19 * 0x80) + 8) ==
                          __n)) {
                        iVar19 = bcmp((void *)(*(long *)(pbStack_10190 +
                                                        (long)(&coded_obu_size + (long)iVar19 * 0x80
                                                              )) + 4),pvStack_100e8,__n);
                        uVar26 = uStack_100f0 & 0xffffffff;
                        bVar35 = iVar19 != 0;
                        psVar24 = (size_t *)((ulong)psVar24 & 0xffffffff);
                        if (!bVar35) {
                          psVar24 = (size_t *)(ulong)uVar27;
                        }
                      }
                      iVar19 = (int)uVar26;
                      uVar27 = (uint)psVar24;
                      bVar36 = false;
                    } while (bVar35);
                  }
                  iVar28 = (int)uStack_10108;
                  if (0 < (int)uVar27) {
                    iVar28 = (uVar27 | 0xffffff80) << 0x18;
                  }
                  iVar15 = (int)uStack_10110;
                  if (0 < (int)uVar27) {
                    iVar15 = 0;
                  }
                }
                *(int *)pbStack_10188 = iVar28;
              }
              uVar26 = (ulong)(iVar19 + (uint)lStack_10180 + iVar15);
              uVar32 = uVar32 + 1;
              pAVar31 = pAStack_10178;
            } while ((ThreadData_conflict *)uVar32 != pTStack_10198);
          }
          uVar12 = (uint32_t)uVar26;
          if (_col != (byte *)(ulong)(iVar13 - 1)) {
            uVar27 = (uVar12 - (int)uVar23) - 4;
            *(uint *)((long)pAStack_10148 + uVar23) = uVar27;
            if (uStack_10164 <= uVar27) {
              uStack_10164 = uVar27;
            }
          }
          pbVar30 = _col + 1;
          uVar23 = uVar26;
        } while (pbVar30 != pbStack_10138);
      }
      av1_accumulate_pack_bs_thread_data(pAVar31,pTStack_10100);
      uVar10 = uStack_100dc;
      pAVar29 = pAStack_10148;
      _tile_size_bytes = (ulong)uStack_1006c << 0x20;
      tile_info.mi_row_start = 0;
      if (1 < (int)pMStack_10150) {
        iVar13 = remux_tiles(pCStack_100d8,(byte *)((long)pAStack_10148 + (ulong)uStack_100dc),
                             uVar12 - uStack_100dc,(uint)uStack_101a0,uStack_10164,&tile_size_bytes,
                             &tile_info.mi_row_start);
        uVar12 = iVar13 + uVar10;
      }
      uVar23 = (ulong)uVar12;
      sVar17 = aom_uleb_size_in_bytes(uVar23);
      memmove((byte *)((long)pAVar29 + sVar17),pAVar29,uVar23);
      coded_obu_size = 0;
      aom_uleb_encode(uVar23,4,(uint8_t *)pAVar29,&coded_obu_size);
      aStack_10128.bit_buffer = aStack_10128.bit_buffer + sVar17;
      if (1 < (int)pMStack_10150) {
        aom_wb_overwrite_literal(&aStack_10128,tile_info.mi_row_start + -1,2);
        aom_wb_overwrite_literal(&aStack_10128,tile_size_bytes + -1,2);
      }
      iStack_10098 = (int)lVar21;
      total_size = (int)sVar17 + uVar12 + iStack_10098;
    }
    dst = pbStack_10140 + total_size;
  }
  *size = (long)dst - (long)pbStack_10158;
  return 0;
}

Assistant:

int av1_pack_bitstream(AV1_COMP *const cpi, uint8_t *dst, size_t dst_size,
                       size_t *size, int *const largest_tile_id) {
  uint8_t *data = dst;
  size_t data_size = dst_size;
  AV1_COMMON *const cm = &cpi->common;
  AV1LevelParams *const level_params = &cpi->ppi->level_params;
  uint32_t obu_header_size = 0;
  uint32_t obu_payload_size = 0;
  FrameHeaderInfo fh_info = { NULL, 0, 0 };
  const uint8_t obu_extension_header =
      cm->temporal_layer_id << 5 | cm->spatial_layer_id << 3 | 0;

  // If no non-zero delta_q has been used, reset delta_q_present_flag
  if (cm->delta_q_info.delta_q_present_flag && cpi->deltaq_used == 0) {
    cm->delta_q_info.delta_q_present_flag = 0;
  }

#if CONFIG_BITSTREAM_DEBUG
  bitstream_queue_reset_write();
#endif

  cpi->frame_header_count = 0;

  // The TD is now written outside the frame encode loop

  // write sequence header obu at each key frame or intra_only frame,
  // preceded by 4-byte size
  if (cm->current_frame.frame_type == INTRA_ONLY_FRAME ||
      cm->current_frame.frame_type == KEY_FRAME) {
    // OBU header is either one or two bytes.
    if (data_size < 2) {
      return AOM_CODEC_ERROR;
    }
    obu_header_size = av1_write_obu_header(
        level_params, &cpi->frame_header_count, OBU_SEQUENCE_HEADER,
        cm->seq_params->has_nonzero_operating_point_idc,
        /*is_layer_specific_obu=*/false, 0, data);
    assert(obu_header_size <= 2);
    obu_payload_size = av1_write_sequence_header_obu(
        cm->seq_params, data + obu_header_size, data_size - obu_header_size);
    const size_t length_field_size =
        obu_memmove(obu_header_size, obu_payload_size, data, data_size);
    if (length_field_size == 0) {
      return AOM_CODEC_ERROR;
    }
    if (av1_write_uleb_obu_size(obu_payload_size, data + obu_header_size,
                                length_field_size) != AOM_CODEC_OK) {
      return AOM_CODEC_ERROR;
    }

    const size_t bytes_written =
        obu_header_size + length_field_size + obu_payload_size;
    data += bytes_written;
    data_size -= bytes_written;
  }

  // write metadata obus before the frame obu that has the show_frame flag set
  if (cm->show_frame) {
    const size_t bytes_written = av1_write_metadata_array(cpi, data, data_size);
    data += bytes_written;
    data_size -= bytes_written;
  }

  const int write_frame_header =
      (cpi->num_tg > 1 || encode_show_existing_frame(cm));
  struct aom_write_bit_buffer saved_wb = { NULL, 0 };
  size_t length_field = 0;
  if (write_frame_header) {
    // Write Frame Header OBU.
    fh_info.frame_header = data;
    // OBU header is either one or two bytes.
    if (data_size < 2) {
      return AOM_CODEC_ERROR;
    }
    obu_header_size = av1_write_obu_header(
        level_params, &cpi->frame_header_count, OBU_FRAME_HEADER,
        cm->seq_params->has_nonzero_operating_point_idc,
        /*is_layer_specific_obu=*/true, obu_extension_header, data);
    // TODO: bug 42302568 - Pass data_size - obu_header_size to
    // write_frame_header_obu().
    obu_payload_size = write_frame_header_obu(cpi, &cpi->td.mb.e_mbd, &saved_wb,
                                              data + obu_header_size, 1);

    length_field =
        obu_memmove(obu_header_size, obu_payload_size, data, data_size);
    if (length_field == 0) {
      return AOM_CODEC_ERROR;
    }
    if (av1_write_uleb_obu_size(obu_payload_size, data + obu_header_size,
                                length_field) != AOM_CODEC_OK) {
      return AOM_CODEC_ERROR;
    }

    fh_info.obu_header_byte_offset = 0;
    fh_info.total_length = obu_header_size + length_field + obu_payload_size;
    // Make sure it is safe to cast fh_info.total_length to uint32_t.
    if (fh_info.total_length > UINT32_MAX) {
      return AOM_CODEC_ERROR;
    }
    data += fh_info.total_length;
    data_size -= fh_info.total_length;
  }

  if (!encode_show_existing_frame(cm)) {
    // Since length_field is determined adaptively after frame header
    // encoding, saved_wb must be adjusted accordingly.
    if (saved_wb.bit_buffer != NULL) {
      saved_wb.bit_buffer += length_field;
    }

    //  Each tile group obu will be preceded by 4-byte size of the tile group
    //  obu
    const size_t bytes_written =
        write_tiles_in_tg_obus(cpi, data, data_size, &saved_wb,
                               obu_extension_header, &fh_info, largest_tile_id);
    data += bytes_written;
    data_size -= bytes_written;
  }
  *size = data - dst;
  (void)data_size;
  return AOM_CODEC_OK;
}